

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

int __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>::
adjustFromLeftSib(NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                  *this,uint32_t size,
                 NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                 *sib,uint32_t sibSize,int toAdd)

{
  uint32_t size_00;
  uint uVar1;
  uint *puVar2;
  uint in_ECX;
  uint in_ESI;
  undefined8 in_RDI;
  uint in_R8D;
  uint32_t count_1;
  uint32_t count;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar3;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  uint local_24 [4];
  uint local_14 [4];
  uint local_4;
  
  if ((int)in_R8D < 1) {
    uVar3 = -in_R8D;
    local_24[0] = in_ECX;
    puVar2 = std::min<unsigned_int>((uint *)&stack0xffffffffffffffc4,local_14);
    uVar1 = 8 - local_24[0];
    puVar2 = std::min<unsigned_int>(puVar2,(uint *)&stack0xffffffffffffffc0);
    uVar4 = *puVar2;
    transferToLeftSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                       *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc,
                      (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                       *)CONCAT44(uVar3,uVar1),(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    local_4 = -uVar4;
  }
  else {
    local_14[0] = in_ESI;
    puVar2 = std::min<unsigned_int>((uint *)&stack0xffffffffffffffd0,local_24);
    size_00 = 8 - local_14[0];
    puVar2 = std::min<unsigned_int>(puVar2,(uint *)&stack0xffffffffffffffcc);
    uVar4 = *puVar2;
    transferToRightSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                        *)CONCAT44(uVar4,in_R8D),size_00,
                       (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    local_4 = uVar4;
  }
  return local_4;
}

Assistant:

int adjustFromLeftSib(uint32_t size, NodeBase& sib, uint32_t sibSize, int toAdd) {
        if (toAdd > 0) {
            // Copy from sibling.
            uint32_t count = std::min(std::min(uint32_t(toAdd), sibSize), Capacity - size);
            sib.transferToRightSib(sibSize, *this, size, count);
            return int(count);
        }
        else {
            // Copy to sibling.
            uint32_t count = std::min(std::min(uint32_t(-toAdd), size), Capacity - sibSize);
            transferToLeftSib(size, sib, sibSize, count);
            return -int(count);
        }
    }